

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  byte bVar1;
  int *piVar2;
  int iVar3;
  anon_union_8_14_b8e57471_for_p4 *paVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = *pMaxFuncArgs;
  piVar2 = p->aLabel;
  *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a | 0x100;
  if (0 < p->nOp) {
    iVar3 = p->nOp + 1;
    paVar4 = &p->aOp->p4;
    do {
      bVar1 = ((Op *)(paVar4 + -2))->opcode;
      *(uchar *)((long)paVar4 + -0xe) = ""[bVar1];
      if (bVar1 < 0x5f) {
        if (bVar1 < 0x51) {
          if (bVar1 == 0x12) {
LAB_00174cc2:
            if ((int)uVar5 <= (int)(uint)*(u8 *)((long)paVar4 + -0xd)) {
              uVar5 = (uint)*(u8 *)((long)paVar4 + -0xd);
            }
          }
          else if (bVar1 == 0x23) {
            if (paVar4[-1].i != 0) goto LAB_00174cac;
            goto LAB_00174ceb;
          }
        }
        else {
LAB_00174ceb:
          if (bVar1 == 0x51) goto LAB_00174cfc;
          if (bVar1 == 0x5c) {
            paVar4->p = sqlite3BtreePrevious;
            goto LAB_00174cff;
          }
        }
      }
      else if (bVar1 < 0x7f) {
        if (bVar1 == 0x5f) {
LAB_00174cfc:
          paVar4->p = sqlite3BtreeNext;
LAB_00174cff:
          *(char *)((long)paVar4 + -0xf) = -0x13;
        }
        else if (bVar1 == 0x7b) goto LAB_00174cc2;
      }
      else if (bVar1 == 0x7f) {
LAB_00174cac:
        p->field_0x9b = p->field_0x9b & 0xfe;
      }
      else {
        if (bVar1 == 0x88) {
          uVar6 = *(uint *)((long)paVar4 + -0x24);
        }
        else {
          if (bVar1 != 0x8c) goto LAB_00174d03;
          uVar6 = paVar4[-1].i;
        }
        if ((int)uVar5 < (int)uVar6) {
          uVar5 = uVar6;
        }
      }
LAB_00174d03:
      if ((((ulong)paVar4->p & 0x10000) != 0) && (paVar4[-1].i < 0)) {
        paVar4[-1].i = piVar2[(uint)~paVar4[-1].i];
      }
      iVar3 = iVar3 + -1;
      paVar4 = paVar4 + 3;
    } while (1 < iVar3);
  }
  sqlite3DbFree(p->db,p->aLabel);
  p->aLabel = (int *)0x0;
  *pMaxFuncArgs = uVar5;
  return;
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int i;
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  int *aLabel = p->aLabel;
  p->readOnly = 1;
  for(pOp=p->aOp, i=p->nOp-1; i>=0; i--, pOp++){
    u8 opcode = pOp->opcode;

    pOp->opflags = sqlite3OpcodeProperty[opcode];
    if( opcode==OP_Function || opcode==OP_AggStep ){
      if( pOp->p5>nMaxArgs ) nMaxArgs = pOp->p5;
    }else if( (opcode==OP_Transaction && pOp->p2!=0) || opcode==OP_Vacuum ){
      p->readOnly = 0;
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( opcode==OP_VUpdate ){
      if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
    }else if( opcode==OP_VFilter ){
      int n;
      assert( p->nOp - i >= 3 );
      assert( pOp[-1].opcode==OP_Integer );
      n = pOp[-1].p1;
      if( n>nMaxArgs ) nMaxArgs = n;
#endif
    }else if( opcode==OP_Next || opcode==OP_SorterNext ){
      pOp->p4.xAdvance = sqlite3BtreeNext;
      pOp->p4type = P4_ADVANCE;
    }else if( opcode==OP_Prev ){
      pOp->p4.xAdvance = sqlite3BtreePrevious;
      pOp->p4type = P4_ADVANCE;
    }

    if( (pOp->opflags & OPFLG_JUMP)!=0 && pOp->p2<0 ){
      assert( -1-pOp->p2<p->nLabel );
      pOp->p2 = aLabel[-1-pOp->p2];
    }
  }
  sqlite3DbFree(p->db, p->aLabel);
  p->aLabel = 0;

  *pMaxFuncArgs = nMaxArgs;
}